

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_encode_tiles_row_mt(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  AV1LfSync *lf_sync;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Bool _Var5;
  uint8_t uVar6;
  uint uVar7;
  uint uVar8;
  TileDataEnc *pTVar9;
  SequenceHeader *pSVar10;
  ENTROPY_CONTEXT *pEVar11;
  MB_MODE_INFO *pMVar12;
  EncWorkerData *pEVar13;
  LFWorkerData *pLVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  MultiThreadInfo *mt_info;
  byte bVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  AV1LfMTInfo *pAVar25;
  int mib_size_log2;
  int lf_id;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  int col;
  int iVar34;
  ulong uVar35;
  size_t __n;
  int i;
  int iVar36;
  int iVar37;
  int *piVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong local_b0;
  int local_84;
  undefined8 local_80;
  ulong local_78;
  int local_6c;
  int *local_68;
  ulong local_60;
  ulong local_58;
  MACROBLOCKD *xd;
  MultiThreadInfo *local_48;
  long local_40;
  long local_38;
  
  cm = &cpi->common;
  uVar24 = (cpi->common).tiles.cols;
  local_78 = (ulong)(int)uVar24;
  bVar21 = (byte)((cpi->common).seq_params)->mib_size_log2;
  uVar7 = (cpi->common).tiles.rows;
  iVar37 = (cpi->common).mi_params.mi_rows;
  iVar22 = (1 << (bVar21 & 0x1f)) + iVar37 + -1 >> (bVar21 & 0x1f);
  uVar8 = (cpi->mt_info).num_mod_workers[4];
  uVar23 = ~(-1 << (bVar21 & 0x1f));
  uVar35 = 0;
  local_58 = 0;
  if (0 < (int)uVar7) {
    local_58 = (ulong)uVar7;
  }
  uVar27 = 0;
  while (iVar34 = (int)uVar35, local_58 != uVar27) {
    piVar38 = (cpi->common).tiles.row_start_sb + uVar27;
    iVar30 = (cpi->common).tiles.row_start_sb[uVar27 + 1] << (bVar21 & 0x1f);
    uVar27 = uVar27 + 1;
    if (iVar37 <= iVar30) {
      iVar30 = iVar37;
    }
    uVar33 = (int)((uVar23 - (*piVar38 << (bVar21 & 0x1f))) + iVar30) >> (bVar21 & 0x1f);
    if (iVar34 <= (int)uVar33) {
      uVar35 = (ulong)uVar33;
    }
  }
  local_48 = &cpi->mt_info;
  iVar37 = (cpi->common).mi_params.mi_cols;
  local_60 = 0;
  if (0 < (int)uVar24) {
    local_60 = (ulong)uVar24;
  }
  uVar27 = 0;
  iVar30 = 0;
  while (local_60 != uVar27) {
    piVar38 = (cpi->common).tiles.col_start_sb + uVar27;
    iVar31 = (cpi->common).tiles.col_start_sb[uVar27 + 1] << (bVar21 & 0x1f);
    uVar27 = uVar27 + 1;
    if (iVar37 <= iVar31) {
      iVar31 = iVar37;
    }
    iVar31 = (int)((uVar23 - (*piVar38 << (bVar21 & 0x1f))) + iVar31) >> (bVar21 & 0x1f);
    if (iVar30 <= iVar31) {
      iVar30 = iVar31;
    }
  }
  bVar39 = true;
  if (((((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar24) &&
       ((cpi->mt_info).enc_row_mt.allocated_tile_rows == uVar7)) &&
      ((cpi->mt_info).enc_row_mt.allocated_rows == iVar34)) &&
     ((cpi->mt_info).enc_row_mt.allocated_cols == iVar30 + -1)) {
    bVar39 = (cpi->mt_info).enc_row_mt.allocated_sb_rows != iVar22;
  }
  local_6c = uVar7 * uVar24;
  if (cpi->allocated_tiles < local_6c) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar39) {
    row_mt_mem_alloc(cpi,iVar34,iVar30,(uint)(cpi->oxcf).algo_cfg.cdf_update_mode);
  }
  uVar24 = (cpi->mt_info).num_workers;
  if ((int)uVar8 < (int)uVar24) {
    uVar24 = uVar8;
  }
  _Var5 = (cpi->common).features.coded_lossless;
  bVar39 = true;
  bVar40 = true;
  if (_Var5 == false) {
    bVar40 = (cpi->common).tiles.large_scale != 0;
  }
  if (((cpi->common).seq_params)->enable_cdef != '\0' && _Var5 == false) {
    bVar39 = (cpi->common).tiles.large_scale != 0;
  }
  iVar37 = (cpi->common).width;
  iVar34 = (cpi->common).superres_upscaled_width;
  iVar31 = is_restoration_used(cm);
  iVar30 = (cpi->ppi->rtc_ref).non_reference_frame;
  if (iVar30 == 0) {
    bVar21 = 1;
    if ((cpi->oxcf).algo_cfg.skip_postproc_filtering == true) {
      bVar16 = cpi->ppi->b_calculate_psnr != 0;
      bVar15 = iVar37 != iVar34;
      bVar41 = (iVar31 != 0 || bVar16) || bVar15;
      if (!bVar39 && ((iVar31 == 0 && !bVar16) && !bVar15)) {
        bVar41 = (cpi->sf).lpf_sf.cdef_pick_method != CDEF_PICK_FROM_Q;
      }
      bVar21 = bVar41 | bVar40;
    }
  }
  else {
    bVar21 = 0;
  }
  piVar38 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id;
  xd = &(cpi->td).mb.e_mbd;
  local_68 = piVar38;
  if ((((cpi->oxcf).mode == '\x01') && (4 < (cpi->oxcf).speed)) &&
     (((cpi->sf).lpf_sf.lpf_pick == '\x03' &&
      ((iVar30 == 0 && ((cpi->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY)))))) {
    bVar21 = ((cpi->common).features.allow_intrabc ^ 1U) & bVar21;
    (cpi->mt_info).pipeline_lpf_mt_with_enc = (uint)bVar21;
    if (bVar21 == 1) {
      (cpi->common).lf.filter_level[0] = 0;
      (cpi->common).lf.filter_level[1] = 0;
      (cpi->common).lf.backup_filter_level[0] = 0;
      (cpi->common).lf.backup_filter_level[1] = 0;
      (cpi->common).cdef_info.cdef_bits = 0;
      (cpi->common).cdef_info.nb_cdef_strengths = 1;
      (cpi->common).cdef_info.cdef_strengths[0] = 0;
      (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
      (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
      if (bVar40 == false) {
        av1_pick_filter_level(cpi->source,cpi,'\x03');
        uVar6 = ((cpi->common).seq_params)->monochrome;
        if (((cpi->mt_info).pipeline_lpf_mt_with_enc != 0) &&
           (((cpi->common).lf.filter_level[0] != 0 || ((cpi->common).lf.filter_level[1] != 0)))) {
          local_84 = 1;
          uVar3 = (cpi->common).lf.filter_level_u;
          uVar4 = (cpi->common).lf.filter_level_v;
          local_80 = ~CONCAT44(-(uint)(uVar4 == 0),-(uint)(uVar3 == 0)) &
                     (ulong)CONCAT14(uVar6 == '\0',(uint)(uVar6 == '\0')) & (ulong)DAT_0043cbe0;
          iVar37 = 0;
          if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
             (iVar37 = 0, 0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
            iVar37 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
          }
          iVar34 = (cpi->common).mi_params.mi_rows;
          av1_loop_filter_frame_init(cm,0,(uint)(uVar6 == '\0') * 2 + 1);
          bVar21 = (byte)((cpi->common).seq_params)->mib_size_log2;
          iVar36 = 1 << (bVar21 & 0x1f);
          bVar21 = bVar21 & 0x1f;
          iVar31 = iVar36 + (cpi->common).mi_params.mi_rows + -1 >> bVar21;
          iVar30 = (cpi->mt_info).num_mod_workers[5];
          lf_sync = &(cpi->mt_info).lf_row_sync;
          if ((((cpi->mt_info).lf_row_sync.sync_range == 0) ||
              (iVar31 != (cpi->mt_info).lf_row_sync.rows)) ||
             ((cpi->mt_info).lf_row_sync.num_workers < iVar30)) {
            av1_loop_filter_dealloc(lf_sync);
            av1_loop_filter_alloc(lf_sync,cm,iVar31,(cpi->common).width,iVar30);
          }
          (cpi->mt_info).lf_row_sync.lf_mt_exit = false;
          for (uVar27 = (ulong)(uint)(0 >> bVar21); uVar27 != 3; uVar27 = uVar27 + 1) {
            memset((cpi->mt_info).lf_row_sync.cur_sb_col[uVar27],0xff,(long)iVar31 << 2);
          }
          pAVar25 = (cpi->mt_info).lf_row_sync.job_queue;
          (cpi->mt_info).lf_row_sync.jobs_enqueued = 0;
          (cpi->mt_info).lf_row_sync.jobs_dequeued = 0;
          iVar30 = 0;
          for (iVar31 = 0; iVar31 != 2; iVar31 = iVar31 + 1) {
            for (iVar26 = 0; iVar26 < iVar34; iVar26 = iVar26 + iVar36) {
              for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
                iVar28 = (int)lVar29;
                if (iVar37 == 2) {
                  if (iVar28 != 2) {
                    iVar20 = local_84;
                    if (iVar28 != 1) goto joined_r0x001b3fe7;
                    if (local_80._4_4_ == 0 && (int)local_80 == 0) goto LAB_001b4011;
                    goto LAB_001b3ff2;
                  }
                }
                else {
                  iVar20 = (&local_84)[lVar29];
joined_r0x001b3fe7:
                  if (iVar20 != 0) {
LAB_001b3ff2:
                    if ((&local_84)[lVar29] != 0) {
                      pAVar25->mi_row = iVar26;
                      pAVar25->plane = iVar28;
                      pAVar25->dir = iVar31;
                      pAVar25->lpf_opt_level = iVar37;
                      pAVar25 = pAVar25 + 1;
                      iVar30 = iVar30 + 1;
                      (cpi->mt_info).lf_row_sync.jobs_enqueued = iVar30;
                    }
                  }
                }
LAB_001b4011:
              }
            }
          }
          uVar27 = (ulong)uVar24;
          lVar29 = uVar27 * 0x2268 + -0x2248;
          while (piVar38 = local_68, 0 < (int)uVar27) {
            uVar27 = uVar27 - 1;
            pEVar13 = (cpi->mt_info).tile_thr_data;
            pEVar13[uVar27].lf_sync = lf_sync;
            pLVar14 = (cpi->mt_info).lf_row_sync.lfdata;
            pEVar13[uVar27].lf_data = pLVar14 + uVar27;
            pLVar14[uVar27].frame_buffer = &((cpi->common).cur_frame)->buf;
            pLVar14[uVar27].cm = cm;
            pLVar14[uVar27].xd = xd;
            for (lVar32 = 0; lVar32 != 0x1e90; lVar32 = lVar32 + 0xa30) {
              puVar1 = (undefined8 *)((long)&(cpi->td).mb.e_mbd.plane[0].pre[-1].buf + lVar32);
              uVar17 = *puVar1;
              uVar18 = puVar1[1];
              puVar1 = (undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar32 + -0x10);
              uVar19 = puVar1[1];
              puVar2 = (undefined8 *)((long)pLVar14->planes[0].pre + lVar32 + lVar29 + -0x30);
              *puVar2 = *puVar1;
              puVar2[1] = uVar19;
              puVar1 = (undefined8 *)((long)(pLVar14->planes[0].pre + -2) + lVar32 + lVar29);
              *puVar1 = uVar17;
              puVar1[1] = uVar18;
              *(undefined8 *)((long)pLVar14->planes[0].pre + lVar32 + lVar29 + -0x4c) =
                   *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar32 + -0x2c);
            }
            lVar29 = lVar29 + -0x2268;
          }
        }
      }
    }
  }
  else {
    (cpi->mt_info).pipeline_lpf_mt_with_enc = 0;
  }
  av1_init_tile_data(cpi);
  memset(piVar38,0xff,0x100);
  memset((cpi->mt_info).enc_row_mt.num_tile_cols_done,0,(long)iVar22 << 2);
  (cpi->mt_info).enc_row_mt.row_mt_exit = false;
  local_40 = local_78 * 0x5d10;
  lVar29 = 0;
  for (local_b0 = 0; uVar27 = local_60, local_38 = lVar29, local_b0 != local_58;
      local_b0 = local_b0 + 1) {
    while (uVar27 != 0) {
      pTVar9 = cpi->tile_data;
      local_78 = uVar27 - 1;
      memset(*(void **)((long)&(pTVar9->row_mt_sync).num_finished_cols + lVar29),0xff,uVar35 << 2);
      *(undefined4 *)((long)&(pTVar9->row_mt_sync).next_mi_row + lVar29) =
           *(undefined4 *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x2e + lVar29);
      *(undefined4 *)((long)&(pTVar9->row_mt_sync).num_threads_working + lVar29) = 0;
      iVar37 = av1_get_intrabc_extra_top_right_sb_delay(cm);
      *(int *)((long)&(pTVar9->row_mt_sync).intrabc_extra_top_right_sb_delay + lVar29) = iVar37;
      av1_inter_mode_data_init
                ((TileDataEnc *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x2e + lVar29));
      iVar37 = *(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x36 + lVar29);
      pSVar10 = (cpi->common).seq_params;
      uVar27 = -1L << ((byte)pSVar10->mib_size_log2 & 0x3f);
      bVar21 = (byte)pSVar10->subsampling_x;
      uVar27 = (long)(int)(~(uint)uVar27 +
                          (*(int *)((long)((pTVar9->tctx).txb_skip_cdf + -1) + 0x3a + lVar29) -
                          iVar37)) & uVar27;
      iVar22 = iVar37 >> (bVar21 & 0x1f);
      uVar6 = pSVar10->monochrome;
      memset((cpi->common).above_contexts.entropy[0][local_b0] + iVar37,0,uVar27);
      if (uVar6 == '\0') {
        pEVar11 = (cpi->common).above_contexts.entropy[1][local_b0];
        if ((pEVar11 == (ENTROPY_CONTEXT *)0x0) ||
           ((cpi->common).above_contexts.entropy[2][local_b0] == (ENTROPY_CONTEXT *)0x0)) {
          aom_internal_error((cpi->td).mb.e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Invalid value of planes");
        }
        else {
          __n = (size_t)((int)uVar27 >> (bVar21 & 0x1f));
          memset(pEVar11 + iVar22,0,__n);
          memset((cpi->common).above_contexts.entropy[2][local_b0] + iVar22,0,__n);
        }
      }
      memset((cpi->common).above_contexts.partition[local_b0] + iVar37,0,uVar27);
      memset((cpi->common).above_contexts.txfm[local_b0] + iVar37,0x40,uVar27);
      lVar29 = lVar29 + 0x5d10;
      uVar27 = local_78;
    }
    lVar29 = local_38 + local_40;
  }
  assign_tile_to_thread(local_68,local_6c,uVar24);
  prepare_enc_workers(cpi,enc_row_mt_worker_hook,uVar24);
  mt_info = local_48;
  launch_workers(local_48,uVar24);
  sync_enc_workers(mt_info,cm,uVar24);
  if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
    pSVar10 = (cpi->common).seq_params;
    iVar37 = pSVar10->mib_size;
    lVar29 = (ulong)(pSVar10->monochrome == '\0') * 2 + 2;
    for (iVar22 = 0; iVar22 < (cpi->common).tiles.rows; iVar22 = iVar22 + 1) {
      for (iVar34 = 0; iVar30 = (cpi->common).tiles.cols, iVar34 < iVar30; iVar34 = iVar34 + 1) {
        iVar30 = iVar30 * iVar22 + iVar34;
        pTVar9 = cpi->tile_data + iVar30;
        for (iVar30 = cpi->tile_data[iVar30].tile_info.mi_row_start;
            iVar30 < (pTVar9->tile_info).mi_row_end; iVar30 = iVar30 + iVar37) {
          if (iVar30 == (pTVar9->tile_info).mi_row_start) {
            av1_reset_loop_filter_delta
                      (xd,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
          }
          for (iVar31 = (pTVar9->tile_info).mi_col_start; iVar31 < (pTVar9->tile_info).mi_col_end;
              iVar31 = iVar31 + iVar37) {
            pMVar12 = (cpi->common).mi_params.mi_grid_base
                      [(cpi->common).mi_params.mi_stride * iVar30 + iVar31];
            if ((pMVar12->skip_txfm == '\x01') &&
               (pMVar12->bsize == ((cpi->common).seq_params)->sb_size)) {
              for (lVar32 = 0; lVar29 != lVar32; lVar32 = lVar32 + 1) {
                pMVar12->delta_lf[lVar32] = (cpi->td).mb.e_mbd.delta_lf[lVar32];
              }
              pMVar12->delta_lf_from_base = (cpi->td).mb.e_mbd.delta_lf_from_base;
            }
            else if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
              (cpi->td).mb.e_mbd.delta_lf_from_base = pMVar12->delta_lf_from_base;
            }
            else {
              for (lVar32 = 0; lVar29 != lVar32; lVar32 = lVar32 + 1) {
                (cpi->td).mb.e_mbd.delta_lf[lVar32] = pMVar12->delta_lf[lVar32];
              }
            }
          }
        }
      }
    }
  }
  accumulate_counters_enc_workers(cpi,uVar24);
  return;
}

Assistant:

void av1_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int sb_rows_in_frame = get_sb_rows_in_frame(cm);
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int max_sb_rows_in_tile = 0, max_sb_cols_in_tile = 0;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  compute_max_sb_rows_cols(cm, &max_sb_rows_in_tile, &max_sb_cols_in_tile);
  const bool alloc_row_mt_mem =
      (enc_row_mt->allocated_tile_cols != tile_cols ||
       enc_row_mt->allocated_tile_rows != tile_rows ||
       enc_row_mt->allocated_rows != max_sb_rows_in_tile ||
       enc_row_mt->allocated_cols != (max_sb_cols_in_tile - 1) ||
       enc_row_mt->allocated_sb_rows != sb_rows_in_frame);
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_sb_rows_in_tile, max_sb_cols_in_tile,
                     cpi->oxcf.algo_cfg.cdf_update_mode);
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  lpf_pipeline_mt_init(cpi, num_workers);

  av1_init_tile_data(cpi);

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  memset(enc_row_mt->num_tile_cols_done, 0,
         sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows_in_frame);
  enc_row_mt->row_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_sb_rows_in_tile);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;
      row_mt_sync->intrabc_extra_top_right_sb_delay =
          av1_get_intrabc_extra_top_right_sb_delay(cm);

      av1_inter_mode_data_init(this_tile);
      av1_zero_above_context(cm, &cpi->td.mb.e_mbd,
                             this_tile->tile_info.mi_col_start,
                             this_tile->tile_info.mi_col_end, tile_row);
    }
  }

  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  prepare_enc_workers(cpi, enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  if (cm->delta_q_info.delta_lf_present_flag) update_delta_lf_for_row_mt(cpi);
  accumulate_counters_enc_workers(cpi, num_workers);
}